

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_mask_util_test.cc
# Opt level: O0

void __thiscall
google::protobuf::util::anon_unknown_0::FieldMaskUtilTest_TestIspathInFieldMask_Test::
FieldMaskUtilTest_TestIspathInFieldMask_Test(FieldMaskUtilTest_TestIspathInFieldMask_Test *this)

{
  FieldMaskUtilTest_TestIspathInFieldMask_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__FieldMaskUtilTest_TestIspathInFieldMask_Test_02a21190;
  return;
}

Assistant:

TEST(FieldMaskUtilTest, TestIspathInFieldMask) {
  FieldMask mask;
  FieldMaskUtil::FromString("foo.bar", &mask);
  EXPECT_FALSE(FieldMaskUtil::IsPathInFieldMask("", mask));
  EXPECT_FALSE(FieldMaskUtil::IsPathInFieldMask("foo", mask));
  EXPECT_TRUE(FieldMaskUtil::IsPathInFieldMask("foo.bar", mask));
  EXPECT_TRUE(FieldMaskUtil::IsPathInFieldMask("foo.bar.baz", mask));
  EXPECT_FALSE(FieldMaskUtil::IsPathInFieldMask("foo.bar0.baz", mask));
}